

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

StrHash hash_dense_def(uint64_t seed,StrHash h,char *str,MSize len)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  bool bVar5;
  char *local_68;
  char *q;
  char *p;
  char *pe;
  uint local_48;
  StrHash a;
  StrHash b;
  MSize len_local;
  char *str_local;
  StrHash h_local;
  uint64_t seed_local;
  
  uVar4 = (uint)(seed >> 0x20);
  uVar2 = (h ^ uVar4) << 4;
  local_48 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
             (uVar2 | (h ^ uVar4) >> 0x1c) << 0x18;
  if (0xc < len) {
    pe._4_4_ = (uint)seed;
    local_68 = str;
    q = str + ((ulong)len - 0xc);
    str_local._4_4_ = h;
    do {
      iVar1 = *(int *)q;
      local_48 = *(int *)(q + 4) + local_48;
      piVar3 = (int *)(q + 8);
      q = local_68;
      str_local._4_4_ =
           (local_48 ^ *piVar3 + str_local._4_4_) - (local_48 * 0x4000 | local_48 >> 0x12);
      pe._4_4_ = (str_local._4_4_ ^ iVar1 + pe._4_4_) -
                 (str_local._4_4_ * 0x800 | str_local._4_4_ >> 0x15);
      local_48 = (pe._4_4_ ^ local_48) - (pe._4_4_ * 0x2000000 | pe._4_4_ >> 7);
      bVar5 = local_68 < str + ((ulong)len - 0xc);
      local_68 = local_68 + 0xc;
    } while (bVar5);
    uVar2 = (local_48 ^ str_local._4_4_) - (local_48 * 0x10000 | local_48 >> 0x10);
    uVar2 = (uVar2 ^ pe._4_4_) - (uVar2 * 0x10 | uVar2 >> 0x1c);
    local_48 = (uVar2 ^ local_48) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  }
  return local_48;
}

Assistant:

static LJ_NOINLINE StrHash hash_dense_def(uint64_t seed, StrHash h,
					  const char *str, MSize len)
{
  StrHash b = lj_bswap(lj_rol(h ^ (StrHash)(seed >> 32), 4));
  if (len > 12) {
    StrHash a = (StrHash)seed;
    const char *pe = str+len-12, *p = pe, *q = str;
    do {
      a += lj_getu32(p);
      b += lj_getu32(p+4);
      h += lj_getu32(p+8);
      p = q; q += 12;
      h ^= b; h -= lj_rol(b, 14);
      a ^= h; a -= lj_rol(h, 11);
      b ^= a; b -= lj_rol(a, 25);
    } while (p < pe);
    h ^= b; h -= lj_rol(b, 16);
    a ^= h; a -= lj_rol(h, 4);
    b ^= a; b -= lj_rol(a, 14);
  }
  return b;
}